

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_pxr24.c
# Opt level: O0

exr_result_t
internal_exr_undo_pxr24
          (exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
          void *uncompressed_data,uint64_t uncompressed_size)

{
  size_t newsz;
  size_t *cursz;
  exr_decode_pipeline_t *in_RCX;
  long in_RDI;
  undefined8 in_R8;
  exr_transcoding_pipeline_buffer_id_t bufid;
  exr_result_t rv;
  void *in_stack_000000a0;
  uint64_t in_stack_000000a8;
  void *in_stack_000000b0;
  uint64_t in_stack_000000b8;
  void *in_stack_000000c0;
  exr_decode_pipeline_t *in_stack_000000c8;
  uint64_t in_stack_000000e0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 local_4;
  
  bufid = (exr_transcoding_pipeline_buffer_id_t)((ulong)in_R8 >> 0x20);
  newsz = in_RDI + 0xb8;
  cursz = (size_t *)(in_RDI + 0xc0);
  exr_compress_max_buffer_size(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  local_4 = internal_decode_alloc_buffer
                      (in_RCX,bufid,
                       (void **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),cursz,
                       newsz);
  if (local_4 == 0) {
    local_4 = undo_pxr24_impl(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
                              in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,
                              in_stack_000000e0);
  }
  return local_4;
}

Assistant:

exr_result_t
internal_exr_undo_pxr24 (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncompressed_size)
{
    exr_result_t rv;
    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(decode->scratch_buffer_1),
        &(decode->scratch_alloc_size_1),
        exr_compress_max_buffer_size (uncompressed_size));
    if (rv != EXR_ERR_SUCCESS) return rv;
    return undo_pxr24_impl (
        decode,
        compressed_data,
        comp_buf_size,
        uncompressed_data,
        uncompressed_size,
        decode->scratch_buffer_1,
        decode->scratch_alloc_size_1);
}